

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string kExpectedSparse;
  string kExpectedDense;
  size_type __dnew_1;
  StringIO stringio;
  TypeParam ht_out;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  Message local_140;
  undefined8 *local_138;
  AssertHelper local_130;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [120];
  pointer local_28;
  
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = local_108._M_string_length & 0xffffffff00000000;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = local_c8._M_string_length & 0xffffffff00000000;
  local_e8._M_dataplus._M_p = local_e8._M_dataplus._M_p & 0xffffffff00000000;
  local_e8._M_string_length = 0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_a0,0,(hasher *)&local_108,(key_equal *)&local_c8,(allocator_type *)&local_e8);
  local_108._M_dataplus._M_p = &DAT_00000018;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_108);
  local_e8.field_2._M_allocated_capacity = (size_type)local_108._M_dataplus._M_p;
  local_e8._M_dataplus._M_p[0] = '\x13';
  local_e8._M_dataplus._M_p[1] = 'W';
  local_e8._M_dataplus._M_p[2] = -0x7a;
  local_e8._M_dataplus._M_p[3] = 'B';
  local_e8._M_dataplus._M_p[4] = '\0';
  local_e8._M_dataplus._M_p[5] = '\0';
  local_e8._M_dataplus._M_p[6] = '\0';
  local_e8._M_dataplus._M_p[7] = '\0';
  local_e8._M_dataplus._M_p[8] = '\0';
  local_e8._M_dataplus._M_p[9] = '\0';
  local_e8._M_dataplus._M_p[10] = '\0';
  local_e8._M_dataplus._M_p[0xb] = ' ';
  local_e8._M_dataplus._M_p[0xc] = '\0';
  local_e8._M_dataplus._M_p[0xd] = '\0';
  local_e8._M_dataplus._M_p[0xe] = '\0';
  local_e8._M_dataplus._M_p[0xf] = '\0';
  local_e8._M_dataplus._M_p[0x10] = '\0';
  local_e8._M_dataplus._M_p[0x11] = '\0';
  local_e8._M_dataplus._M_p[0x12] = '\0';
  local_e8._M_dataplus._M_p[0x13] = '\0';
  local_e8._M_dataplus._M_p[0x14] = '\0';
  local_e8._M_dataplus._M_p[0x15] = '\0';
  local_e8._M_dataplus._M_p[0x16] = '\0';
  local_e8._M_dataplus._M_p[0x17] = '\0';
  local_e8._M_string_length = (size_type)local_108._M_dataplus._M_p;
  local_e8._M_dataplus._M_p[(long)local_108._M_dataplus._M_p] = '\0';
  local_c8._M_dataplus._M_p = (pointer)0x14;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_c8);
  local_108.field_2._M_allocated_capacity = (size_type)local_c8._M_dataplus._M_p;
  builtin_strncpy(local_108._M_dataplus._M_p,"$hu1",5);
  local_108._M_dataplus._M_p[5] = '\0';
  local_108._M_dataplus._M_p[6] = '\0';
  local_108._M_dataplus._M_p[7] = ' ';
  local_108._M_dataplus._M_p[8] = '\0';
  local_108._M_dataplus._M_p[9] = '\0';
  local_108._M_dataplus._M_p[10] = '\0';
  local_108._M_dataplus._M_p[0xb] = '\0';
  local_108._M_dataplus._M_p[0xc] = '\0';
  local_108._M_dataplus._M_p[0xd] = '\0';
  local_108._M_dataplus._M_p[0xe] = '\0';
  local_108._M_dataplus._M_p[0xf] = '\0';
  local_108._M_dataplus._M_p[0x10] = '\0';
  local_108._M_dataplus._M_p[0x11] = '\0';
  local_108._M_dataplus._M_p[0x12] = '\0';
  local_108._M_dataplus._M_p[0x13] = '\0';
  local_108._M_string_length = (size_type)local_c8._M_dataplus._M_p;
  local_108._M_dataplus._M_p[(long)local_c8._M_dataplus._M_p] = '\0';
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_a8 = &local_c8;
  local_140.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       google::
       dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
       ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                 ((dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                   *)(local_a0 + 8));
  local_138 = (undefined8 *)0x0;
  if (!(bool)local_140.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_140,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55b,(char *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                       (char)local_128._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
        &local_128.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p));
    }
    if (local_148._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_148._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  puVar1 = local_138;
  if (local_138 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_138 != local_138 + 2) {
      operator_delete((undefined8 *)*local_138);
    }
    operator_delete(puVar1);
  }
  if (*local_c8._M_dataplus._M_p == *local_e8._M_dataplus._M_p) {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_128,"kExpectedDense","stringbuf",&local_e8,&local_c8);
    if ((char)local_128._M_dataplus._M_p != '\0') goto LAB_009cd324;
    testing::Message::Message(&local_140);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,&local_140);
  }
  else {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_128,"kExpectedSparse","stringbuf",&local_108,&local_c8);
    if ((char)local_128._M_dataplus._M_p != '\0') goto LAB_009cd324;
    testing::Message::Message(&local_140);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,&local_140);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
  if ((long *)CONCAT71(local_140.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_140.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_140.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_140.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
LAB_009cd324:
  if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_128._M_string_length !=
        (undefined8 *)(local_128._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_128._M_string_length);
    }
    operator_delete((void *)local_128._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_a0._0_8_ = &PTR__BaseHashtableInterface_00c24338;
  if (local_28 != (pointer)0x0) {
    free(local_28);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}